

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int l;
  int iVar21;
  int k_1;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  for (uVar17 = 0; uVar17 != (uint)(~(partitionCount >> 0x1f) & partitionCount); uVar17 = uVar17 + 1
      ) {
    uVar11 = this->kStateCount;
    iVar3 = this->kPartialsPaddedStateCount;
    iVar4 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar17]];
    iVar5 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar17] + 1];
    lVar23 = (long)iVar5;
    lVar12 = (long)iVar4;
    pdVar7 = this->gPartials[bufferIndices[uVar17]];
    pdVar8 = this->gCategoryWeights[categoryWeightsIndices[uVar17]];
    uVar6 = cumulativeScaleIndices[uVar17];
    iVar16 = iVar3 * iVar4;
    pdVar9 = this->gStateFrequencies[stateFrequenciesIndices[uVar17]];
    iVar14 = uVar11 * iVar4;
    iVar15 = -(~((int)uVar11 >> 0x1f) & uVar11);
    iVar18 = iVar14;
    for (iVar19 = iVar4; iVar19 < iVar5; iVar19 = iVar19 + 1) {
      lVar22 = 0;
      pdVar10 = this->integrationTmp;
      for (iVar24 = 0; iVar15 != iVar24; iVar24 = iVar24 + -1) {
        *(double *)((long)pdVar10 + lVar22 + (long)iVar18 * 8) =
             *(double *)((long)pdVar7 + lVar22 + (long)iVar16 * 8) * *pdVar8;
        lVar22 = lVar22 + 8;
      }
      iVar16 = iVar16 - iVar24;
      iVar18 = iVar18 - iVar24;
    }
    iVar19 = this->kCategoryCount;
    iVar18 = this->kPatternCount;
    for (lVar22 = 1; lVar25 = lVar12, lVar22 < iVar19; lVar22 = lVar22 + 1) {
      iVar16 = iVar16 + ((iVar4 - iVar5) + iVar18) * iVar3;
      iVar21 = iVar14;
      for (iVar24 = iVar4; iVar24 < iVar5; iVar24 = iVar24 + 1) {
        lVar25 = 0;
        iVar20 = 0;
        pdVar10 = this->integrationTmp;
        while (iVar15 != iVar20) {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)((long)pdVar7 + lVar25 + (long)iVar16 * 8);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = pdVar8[lVar22];
          iVar20 = iVar20 + -1;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)((long)pdVar10 + lVar25 + (long)iVar21 * 8);
          auVar28 = vfmadd213sd_fma(auVar29,auVar27,auVar28);
          *(long *)((long)pdVar10 + lVar25 + (long)iVar21 * 8) = auVar28._0_8_;
          lVar25 = lVar25 + 8;
        }
        iVar16 = iVar16 - iVar20;
        iVar21 = iVar21 - iVar20;
      }
    }
    for (; lVar25 < lVar23; lVar25 = lVar25 + 1) {
      auVar28 = ZEXT816(0) << 0x40;
      uVar11 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
      for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
        auVar30._8_8_ = 0;
        auVar30._0_8_ = pdVar9[uVar13];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = this->integrationTmp[(long)iVar14 + uVar13];
        auVar28 = vfmadd231sd_fma(auVar28,auVar30,auVar1);
      }
      iVar14 = iVar14 + uVar11;
      dVar26 = log(auVar28._0_8_);
      this->outLogLikelihoodsTmp[lVar25] = dVar26;
    }
    if (-1 < (int)uVar6) {
      pdVar7 = this->outLogLikelihoodsTmp;
      pdVar8 = this->gScaleBuffers[uVar6];
      for (lVar22 = lVar12; lVar22 < lVar23; lVar22 = lVar22 + 1) {
        pdVar7[lVar22] = pdVar8[lVar22] + pdVar7[lVar22];
      }
    }
    auVar28 = ZEXT816(0) << 0x40;
    outSumLogLikelihoodByPartition[uVar17] = 0.0;
    pdVar7 = this->gPatternWeights;
    pdVar8 = this->outLogLikelihoodsTmp;
    for (; lVar12 < lVar23; lVar12 = lVar12 + 1) {
      auVar31._8_8_ = 0;
      auVar31._0_8_ = pdVar8[lVar12];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pdVar7[lVar12];
      auVar28 = vfmadd231sd_fma(auVar28,auVar31,auVar2);
      outSumLogLikelihoodByPartition[uVar17] = auVar28._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                         const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* cumulativeScaleIndices,
                                                         const int* partitionIndices,
                                                         int partitionCount,
                                                         double* outSumLogLikelihoodByPartition) {

    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[p]];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];
        int u = startPattern * kStateCount;
        int v = startPattern * kPartialsPaddedStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = startPattern * kStateCount;
            v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            for (int k = startPattern; k < endPattern; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = startPattern * kStateCount;
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += freqs[i] * integrationTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sum);
        }

        if (scalingFactorsIndex >= 0) {
            const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
            for(int i=startPattern; i<endPattern; i++) {
                outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
            }
        }

        outSumLogLikelihoodByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p] += outLogLikelihoodsTmp[i] * gPatternWeights[i];
        }

    }

}